

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O3

void __thiscall deqp::egl::anon_unknown_4::GLES2Program::setup(GLES2Program *this)

{
  GLenum err;
  
  (*this->m_gl->useProgram)((this->m_program).m_program.m_program);
  (*this->m_gl->enableVertexAttribArray)(this->m_positionLoc);
  (*this->m_gl->enableVertexAttribArray)(this->m_colorLoc);
  err = (*this->m_gl->getError)();
  glu::checkError(err,"Program setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                  ,0x1fb);
  return;
}

Assistant:

void setup (void) const
	{
		m_gl.useProgram(m_program.getProgram());
		m_gl.enableVertexAttribArray(m_positionLoc);
		m_gl.enableVertexAttribArray(m_colorLoc);
		GLU_CHECK_GLW_MSG(m_gl, "Program setup failed");
	}